

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O1

void __thiscall wasm::RemoveNonJSOpsPass::visitStore(RemoveNonJSOpsPass *this,Store *curr)

{
  ulong uVar1;
  Expression *pEVar2;
  int iVar3;
  uintptr_t uVar4;
  Unary *this_00;
  UnaryOp UVar5;
  
  uVar1 = (curr->align).addr;
  if ((uVar1 != 0) && (uVar1 < curr->bytes)) {
    uVar1 = (curr->valueType).id;
    if (6 < uVar1) {
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    iVar3 = (int)uVar1;
    if (iVar3 == 4) {
      UVar5 = ReinterpretFloat32;
      uVar4 = 2;
    }
    else {
      if (iVar3 != 5) {
        return;
      }
      UVar5 = ReinterpretFloat64;
      uVar4 = 3;
    }
    (curr->valueType).id = uVar4;
    pEVar2 = curr->value;
    this_00 = (Unary *)MixedArena::allocSpace
                                 (&((this->builder)._M_t.
                                    super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                    .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                   wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = UVar5;
    this_00->value = pEVar2;
    Unary::finalize(this_00);
    curr->value = (Expression *)this_00;
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (curr->align == 0 || curr->align >= curr->bytes) {
      return;
    }

    // Switch unaligned stores of floats to unaligned stores of integers (which
    // we can actually implement) and then use reinterpretation to store the
    // right value.
    switch (curr->valueType.getBasic()) {
      case Type::f32:
        curr->valueType = Type::i32;
        curr->value = builder->makeUnary(ReinterpretFloat32, curr->value);
        break;
      case Type::f64:
        curr->valueType = Type::i64;
        curr->value = builder->makeUnary(ReinterpretFloat64, curr->value);
        break;
      default:
        break;
    }
  }